

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgDConstructGridGlobal.hpp
# Opt level: O2

forward_list<TasGrid::TensorData,_std::allocator<TasGrid::TensorData>_> __thiscall
TasGrid::readTensorDataList<TasGrid::IO::mode_ascii_type>
          (TasGrid *this,istream *is,size_t num_dimensions)

{
  int iVar1;
  unsigned_long in_RCX;
  int iVar2;
  bool bVar3;
  TensorData local_a0;
  
  *(undefined8 *)this = 0;
  iVar1 = IO::readNumber<TasGrid::IO::mode_ascii_type,int>(is);
  iVar2 = 0;
  if (0 < iVar1) {
    iVar2 = iVar1;
  }
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    local_a0.weight = IO::readNumber<TasGrid::IO::mode_ascii_type,double>(is);
    IO::readVector<TasGrid::IO::mode_ascii_type,int,unsigned_long>
              (&local_a0.tensor,(IO *)is,(istream *)num_dimensions,in_RCX);
    local_a0.points.num_dimensions = 0;
    local_a0.points.cache_num_indexes = 0;
    local_a0.loaded.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_finish.super__Bit_iterator_base._M_offset = 0;
    local_a0.loaded.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_finish.super__Bit_iterator_base._12_4_ = 0;
    local_a0.loaded.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
    local_a0.loaded.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._M_offset = 0;
    local_a0.loaded.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._12_4_ = 0;
    local_a0.loaded.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_a0.points.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_a0.loaded.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_a0.points.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_a0.points.indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    ::std::forward_list<TasGrid::TensorData,_std::allocator<TasGrid::TensorData>_>::
    emplace_front<TasGrid::TensorData>
              ((forward_list<TasGrid::TensorData,_std::allocator<TasGrid::TensorData>_> *)this,
               &local_a0);
    TensorData::~TensorData(&local_a0);
  }
  return (_Fwd_list_base<TasGrid::TensorData,_std::allocator<TasGrid::TensorData>_>)
         (_Fwd_list_base<TasGrid::TensorData,_std::allocator<TasGrid::TensorData>_>)this;
}

Assistant:

std::forward_list<TensorData> readTensorDataList(std::istream &is, size_t num_dimensions){
    std::forward_list<TensorData> tensors;
    int num_entries = IO::readNumber<iomode, int>(is);

    for(int i=0; i<num_entries; i++){
        tensors.emplace_front(TensorData{
                              IO::readNumber<iomode, double>(is), // weight
                              IO::readVector<iomode, int>(is, num_dimensions), // tensor
                              MultiIndexSet(), // points, will be set later
                              std::vector<bool>() // loaded, will be set later
                              });
    }

    return tensors;
}